

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MQTT.hpp
# Opt level: O1

uint32 __thiscall
Protocol::MQTT::V5::VisitorVariant::acceptBuffer(VisitorVariant *this,uint8 *buf,uint32 bufLength)

{
  uint32 uVar1;
  
  switch(this->type) {
  case '\0':
  case '\x01':
  case '\x02':
  case '\x03':
    break;
  case '\x04':
  case '\x05':
  case '\x06':
    this = (VisitorVariant *)(this->buffer + 8);
    break;
  default:
    this = (VisitorVariant *)0x0;
  }
  if (this == (VisitorVariant *)0x0) {
    return 0xffffffff;
  }
  uVar1 = (*(code *)**(undefined8 **)this->buffer)();
  return uVar1;
}

Assistant:

MemMappedVisitor * getBase()
                {
                    switch(type)
                    {
                    case 0: return static_cast<MemMappedVisitor*>(reinterpret_cast< PODVisitor<uint8>* >             (buffer));
                    case 1: return static_cast<MemMappedVisitor*>(reinterpret_cast< LittleEndianPODVisitor<uint16>* >(buffer));
                    case 2: return static_cast<MemMappedVisitor*>(reinterpret_cast< LittleEndianPODVisitor<uint32>* >(buffer));
                    case 3: return static_cast<MemMappedVisitor*>(reinterpret_cast< MappedVBInt *>                   (buffer));
                    case 4: return static_cast<MemMappedVisitor*>(reinterpret_cast< DynamicBinDataView *>            (buffer));
                    case 5: return static_cast<MemMappedVisitor*>(reinterpret_cast< DynamicStringView *>             (buffer));
                    case 6: return static_cast<MemMappedVisitor*>(reinterpret_cast< DynamicStringPairView *>         (buffer));
                    default: return 0;
                    }
                }